

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable_iterator<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
::advance_past_deleted
          (sparse_hashtable_iterator<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
           *this)

{
  bool bVar1;
  iterator *in_RDI;
  sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
  *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  iterator *it;
  
  it = in_RDI;
  while( true ) {
    bVar1 = two_d_iterator<std::vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>_>
            ::operator!=((two_d_iterator<std::vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>_>
                          *)in_RDI,
                         (iterator *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    in_stack_ffffffffffffffef = false;
    if (bVar1) {
      in_stack_ffffffffffffffef =
           sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
           ::test_deleted(unaff_retaddr,it);
    }
    if ((bool)in_stack_ffffffffffffffef == false) break;
    two_d_iterator<std::vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>_>
    ::operator++((two_d_iterator<std::vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>_>
                  *)in_RDI);
  }
  return;
}

Assistant:

void advance_past_deleted() {
    while (pos != end && ht->test_deleted(*this)) ++pos;
  }